

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O1

void __thiscall
QGraphicsWidgetPrivate::windowFrameHoverLeaveEvent
          (QGraphicsWidgetPrivate *this,QGraphicsSceneHoverEvent *event)

{
  undefined4 uVar1;
  QGraphicsItem *pQVar2;
  WindowData *pWVar3;
  undefined4 uVar4;
  QGraphicsItem *pQVar5;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  double local_28;
  double local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((~(this->windowFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 0x1001) == 0) {
    pQVar2 = (this->super_QGraphicsItemPrivate).q_ptr;
    pQVar5 = pQVar2 + -1;
    if (pQVar2 == (QGraphicsItem *)0x0) {
      pQVar5 = (QGraphicsItem *)0x0;
    }
    QGraphicsItem::unsetCursor(pQVar5 + 1);
    ensureWindowData(this);
    pWVar3 = (this->windowData)._M_t.
             super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ._M_t.
             super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
    if ((pWVar3->hoveredSubControl == SC_ComboBoxListBoxPopup) || ((pWVar3->field_0x20 & 1) != 0)) {
      pWVar3->hoveredSubControl = SC_None;
      pWVar3->field_0x20 = pWVar3->field_0x20 & 0xfe;
      pWVar3 = (this->windowData)._M_t.
               super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
               ._M_t.
               super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
               .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
      (pWVar3->buttonRect).x1 = 0;
      (pWVar3->buttonRect).y1 = 0;
      (pWVar3->buttonRect).x2 = -1;
      (pWVar3->buttonRect).y2 = -1;
      pWVar3 = (this->windowData)._M_t.
               super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
               ._M_t.
               super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
               .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
      uVar1 = (pWVar3->buttonRect).x1;
      uVar4 = (pWVar3->buttonRect).y1;
      local_38._8_4_ = SUB84((double)(int)uVar4,0);
      local_38._0_8_ = (double)(int)uVar1;
      local_38._12_4_ = (int)((ulong)(double)(int)uVar4 >> 0x20);
      local_28 = (double)(((long)(pWVar3->buttonRect).x2.m_i - (long)(int)uVar1) + 1);
      local_20 = (double)(((long)(pWVar3->buttonRect).y2.m_i - (long)(int)uVar4) + 1);
      QGraphicsItem::update(pQVar5 + 1,(QRectF *)local_38);
    }
    else {
      pWVar3->hoveredSubControl = SC_None;
      pWVar3->field_0x20 = pWVar3->field_0x20 & 0xfe;
      pWVar3 = (this->windowData)._M_t.
               super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
               ._M_t.
               super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
               .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
      (pWVar3->buttonRect).x1 = 0;
      (pWVar3->buttonRect).y1 = 0;
      (pWVar3->buttonRect).x2 = -1;
      (pWVar3->buttonRect).y2 = -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidgetPrivate::windowFrameHoverLeaveEvent(QGraphicsSceneHoverEvent *event)
{
    Q_UNUSED(event);
    Q_Q(QGraphicsWidget);
    if (hasDecoration()) {
        // ### restore the cursor, don't override it
#ifndef QT_NO_CURSOR
        q->unsetCursor();
#endif

        ensureWindowData();

        bool needsUpdate = false;
        if (windowData->hoveredSubControl == QStyle::SC_TitleBarCloseButton
            || windowData->buttonMouseOver)
            needsUpdate = true;

        // update the hover state (of buttons etc...)
        windowData->hoveredSubControl = QStyle::SC_None;
        windowData->buttonMouseOver = false;
        windowData->buttonRect = QRect();
        if (needsUpdate)
            q->update(windowData->buttonRect);
    }
}